

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::DepthRangeWriteCase::iterate(DepthRangeWriteCase *this)

{
  TestLog *pTVar1;
  RenderContext *pRVar2;
  Vec4 *pVVar3;
  undefined1 auVar4 [12];
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  GLuint index;
  GLenum GVar8;
  uint uVar9;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  char *description;
  int stepNdx;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  float fVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  Vec4 color;
  Surface referenceFrame;
  Surface renderedFrame;
  ProgramSources sources;
  Random rnd;
  ShaderProgram program;
  undefined1 local_340 [8];
  float local_338;
  undefined4 local_334;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  Surface local_320;
  TestLog *local_308;
  Surface local_300;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  value_type local_2b8;
  undefined1 local_298 [8];
  float local_290;
  undefined8 local_28c;
  int local_284;
  float local_280 [5];
  undefined8 local_26c;
  undefined4 local_264;
  float local_260;
  undefined4 local_25c;
  ios_base local_220 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_208;
  undefined1 local_1e8 [216];
  deRandom local_110;
  ShaderProgram local_100;
  int *piVar10;
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_110,dVar6);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar10 = (int *)CONCAT44(extraout_var,iVar7);
  iVar7 = *piVar10;
  iVar11 = 0x80;
  if (iVar7 < 0x80) {
    iVar11 = iVar7;
  }
  iVar12 = 0x80;
  if (piVar10[1] < 0x80) {
    iVar12 = piVar10[1];
  }
  dVar6 = deRandom_getUint32(&local_110);
  local_2d8._0_4_ = dVar6 % ((iVar7 - iVar11) + 1U);
  iVar7 = piVar10[1];
  dVar6 = deRandom_getUint32(&local_110);
  local_2e8._0_4_ = dVar6 % ((iVar7 - iVar12) + 1U);
  tcu::Surface::Surface(&local_300,iVar11,iVar12);
  tcu::Surface::Surface(&local_320,iVar11,iVar12);
  local_308 = pTVar1;
  if (piVar10[6] == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Depth buffer is required",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0x130);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_340 = (undefined1  [8])&local_330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,
             "attribute highp vec4 a_position;\nattribute highp vec2 a_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,"");
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "uniform mediump vec4 u_color;\nvoid main (void)\n{\n\tgl_FragColor = u_color;\n}\n",""
            );
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_298,0,0xac);
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8[8] = 0;
  local_1e8._9_7_ = 0;
  local_1e8[0x10] = 0;
  local_1e8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298,(value_type *)local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_280,&local_2b8);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar2,(ProgramSources *)local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_208);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_298 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_340 != (undefined1  [8])&local_330) {
    operator_delete((void *)local_340,local_330._M_allocated_capacity + 1);
  }
  if (local_100.m_program.m_info.linkOk == false) {
    glu::operator<<(local_308,&local_100);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0x137);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_2c8._0_4_ = glwGetUniformLocation(local_100.m_program.m_program,"u_color");
  index = glwGetAttribLocation(local_100.m_program.m_program,"a_position");
  local_298 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_290);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_290,"glDepthRangef(",0xe);
  std::ostream::_M_insert<double>((double)this->m_zNear);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_290,", ",2);
  std::ostream::_M_insert<double>((double)this->m_zFar);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_290,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_290);
  std::ios_base::~ios_base(local_220);
  glwViewport(local_2d8._0_4_,local_2e8._0_4_,iVar11,iVar12);
  glwClear(0x4500);
  glwEnable(0xb71);
  glwUseProgram(local_100.m_program.m_program);
  glwEnableVertexAttribArray(index);
  local_298._0_4_ = 0xbf800000;
  local_298._4_4_ = 0xbf800000;
  pVVar3 = this->m_depthCoord;
  local_290 = pVVar3->m_data[0];
  local_28c = 0xbf8000003f800000;
  local_284 = 0x3f800000;
  local_280[0] = pVVar3->m_data[1];
  local_280._4_8_ = 0x3f8000003f800000;
  local_280[3] = -1.0;
  local_280[4] = pVVar3->m_data[2];
  local_26c = 0x3f8000003f800000;
  local_264 = 0x3f800000;
  local_260 = pVVar3->m_data[3];
  local_25c = 0x3f800000;
  glwDepthFunc(0x207);
  glwDepthRangef(this->m_zNear,this->m_zFar);
  glwUniform4f(local_2c8._0_4_,0.0,1.0,0.0,1.0);
  glwVertexAttribPointer(index,4,0x1406,'\0',0,local_298);
  glwDrawElements(4,6,0x1403,iterate::quadIndices);
  GVar8 = glwGetError();
  glu::checkError(GVar8,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                  ,0x156);
  glwDepthFunc(0x203);
  glwDepthMask('\0');
  glwDepthRangef(0.0,1.0);
  iVar7 = 0;
  do {
    local_338 = (float)iVar7 * 0.032258064;
    local_340._4_4_ = local_338;
    local_340._0_4_ = local_338;
    local_290 = local_338 + local_338 + -1.0;
    local_334 = 0x3f800000;
    local_298._0_4_ = 0xbf800000;
    local_298._4_4_ = 0xbf800000;
    local_28c = 0xbf8000003f800000;
    local_284 = 0x3f800000;
    local_280._4_8_ = 0x3f8000003f800000;
    local_280[3] = -1.0;
    local_26c = 0x3f8000003f800000;
    local_264 = 0x3f800000;
    local_25c = 0x3f800000;
    local_280[0] = local_290;
    local_280[4] = local_290;
    local_260 = local_290;
    glwUniform4fv(local_2c8._0_4_,1,(GLfloat *)local_340);
    glwVertexAttribPointer(index,4,0x1406,'\0',0,local_298);
    glwDrawElements(4,6,0x1403,iterate::quadIndices);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x20);
  GVar8 = glwGetError();
  glu::checkError(GVar8,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                  ,0x172);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_340._0_4_ = RGBA;
  local_340._4_4_ = UNORM_INT8;
  if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
    local_300.m_pixels.m_cap = (size_t)local_300.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_298,(TextureFormat *)local_340,local_300.m_width,
             local_300.m_height,1,(void *)local_300.m_pixels.m_cap);
  glu::readPixels(pRVar2,local_2d8._0_4_,local_2e8._0_4_,(PixelBufferAccess *)local_298);
  if (0 < local_320.m_height) {
    pVVar3 = this->m_depthCoord;
    fVar19 = this->m_zNear;
    fVar20 = this->m_zFar;
    fVar15 = 1.0;
    if (fVar19 <= 1.0) {
      fVar15 = fVar19;
    }
    fVar15 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar15);
    auVar16 = ZEXT812(0x3f800000);
    if (fVar20 <= 1.0) {
      auVar16._4_8_ = 0;
      auVar16._0_4_ = fVar20;
    }
    fVar19 = (float)(~-(uint)(fVar20 < 0.0) & auVar16._0_4_);
    auVar4._4_8_ = 0;
    auVar4._0_4_ = auVar16._8_4_;
    local_2e8._0_4_ = (fVar19 - fVar15) * 0.5;
    local_2e8._4_8_ = SUB128(auVar4 << 0x40,4);
    local_2e8._12_4_ = 0;
    local_2d8._4_4_ = 0;
    local_2d8._0_4_ = (fVar19 + fVar15) * 0.5;
    local_2d8._8_4_ = auVar16._8_4_;
    local_2d8._12_4_ = 0;
    iVar12 = 0;
    iVar7 = local_320.m_height;
    iVar11 = local_320.m_width;
    do {
      if (0 < iVar11) {
        local_2c8 = ZEXT416((uint)((float)iVar12 + 0.5));
        iVar13 = 0;
        do {
          auVar17._0_4_ = (float)iVar13 + 0.5;
          auVar17._4_4_ = local_2c8._0_4_;
          auVar17._8_4_ = 0;
          auVar17._12_4_ = local_2c8._4_4_;
          auVar18._0_4_ = (float)iVar11;
          auVar18._4_4_ = (float)local_320.m_height;
          auVar18._8_8_ = 0;
          auVar18 = divps(auVar17,auVar18);
          fVar20 = auVar18._0_4_;
          fVar19 = auVar18._4_4_;
          if (1.0 <= fVar19 + fVar20) {
            fVar15 = pVVar3->m_data[3];
            fVar20 = (pVVar3->m_data[1] - fVar15) * (1.0 - fVar20) + fVar15;
            fVar19 = (pVVar3->m_data[2] - fVar15) * (1.0 - fVar19);
          }
          else {
            fVar15 = pVVar3->m_data[0];
            fVar20 = (pVVar3->m_data[2] - fVar15) * fVar20 + fVar15;
            fVar19 = (pVVar3->m_data[1] - fVar15) * fVar19;
          }
          fVar19 = floorf(((fVar19 + fVar20) * (float)local_2e8._0_4_ + (float)local_2d8._0_4_) /
                          0.032258064);
          fVar19 = (float)(int)fVar19 * 0.032258064 * 255.0;
          uVar9 = (uint)(fVar19 + *(float *)(&DAT_01b77e94 + (ulong)(fVar19 < 0.0) * 4));
          if (0xfe < (int)uVar9) {
            uVar9 = 0xff;
          }
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          *(uint *)((long)local_320.m_pixels.m_ptr + (long)(iVar11 * iVar12 + iVar13) * 4) =
               uVar9 << 0x10 | uVar9 << 8 | uVar9 | 0xff000000;
          iVar13 = iVar13 + 1;
          iVar7 = local_320.m_height;
          iVar11 = local_320.m_width;
        } while (iVar13 < local_320.m_width);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < iVar7);
  }
  bVar5 = tcu::fuzzyCompare(local_308,"Result","Image comparison result",&local_320,&local_300,0.05,
                            COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar5) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,description
            );
  glu::ShaderProgram::~ShaderProgram(&local_100);
  tcu::Surface::~Surface(&local_320);
  tcu::Surface::~Surface(&local_300);
  return STOP;
}

Assistant:

DepthRangeWriteCase::IterateResult DepthRangeWriteCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	const int					viewportW		= de::min(128, renderTarget.getWidth());
	const int					viewportH		= de::min(128, renderTarget.getHeight());
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const int					numDepthSteps	= VISUALIZE_DEPTH_STEPS;
	const float					depthStep		= 1.0f/(float)(numDepthSteps-1);

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_fragmentShaderSrc));

	if (!program.isOk())
	{
		log << program;
		TCU_FAIL("Compile failed");
	}

	const int					colorLoc		= glGetUniformLocation(program.getProgram(), "u_color");
	const int					posLoc			= glGetAttribLocation(program.getProgram(), "a_position");

	m_testCtx.getLog() << TestLog::Message << "glDepthRangef(" << m_zNear << ", " << m_zFar << ")" << TestLog::EndMessage;

	glViewport(viewportX, viewportY, viewportW, viewportH);
	glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);
	glUseProgram(program.getProgram());
	glEnableVertexAttribArray(posLoc);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Render with depth range.
	{
		const float position[] =
		{
			-1.0f, -1.0f, m_depthCoord[0], 1.0f,
			-1.0f, +1.0f, m_depthCoord[1], 1.0f,
			+1.0f, -1.0f, m_depthCoord[2], 1.0f,
			+1.0f, +1.0f, m_depthCoord[3], 1.0f
		};

		glDepthFunc(GL_ALWAYS);
		glDepthRangef(m_zNear, m_zFar);
		glUniform4f(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);
		GLU_CHECK();
	}

	// Visualize by rendering full-screen quads with increasing depth and color.
	{
		glDepthFunc(GL_LEQUAL);
		glDepthMask(GL_FALSE);
		glDepthRangef(0.0f, 1.0f);

		for (int stepNdx = 0; stepNdx < numDepthSteps; stepNdx++)
		{
			float	f		= (float)stepNdx*depthStep;
			float	depth	= f*2.0f - 1.0f;
			Vec4	color	= Vec4(f, f, f, 1.0f);

			float position[] =
			{
				-1.0f, -1.0f, depth, 1.0f,
				-1.0f, +1.0f, depth, 1.0f,
				+1.0f, -1.0f, depth, 1.0f,
				+1.0f, +1.0f, depth, 1.0f
			};

			glUniform4fv(colorLoc, 1, color.getPtr());
			glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
			glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);
		}

		GLU_CHECK();
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		for (int x = 0; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
			float	d		= depthRangeTransform(triQuadInterpolate(xf, yf, m_depthCoord), m_zNear, m_zFar);
			int		step	= (int)deFloatFloor(d / depthStep);
			int		col		= de::clamp(deRoundFloatToInt32((float)step*depthStep*255.0f), 0, 255);

			referenceFrame.setPixel(x, y, tcu::RGBA(col, col, col, 0xff));
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}